

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsidebar.cpp
# Opt level: O1

bool __thiscall QSidebar::event(QSidebar *this,QEvent *event)

{
  bool bVar1;
  
  if ((*(short *)(event + 8) == 7) && (*(int *)(event + 0x40) == 0x1000007)) {
    removeEntry(this);
    return true;
  }
  bVar1 = QListView::event(&this->super_QListView,event);
  return bVar1;
}

Assistant:

bool QSidebar::event(QEvent * event)
{
    if (event->type() == QEvent::KeyRelease) {
        QKeyEvent *ke = static_cast<QKeyEvent *>(event);
        if (ke->key() == Qt::Key_Delete) {
            removeEntry();
            return true;
        }
    }
    return QListView::event(event);
}